

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

void __thiscall
ot::commissioner::DtlsSession::DtlsSession
          (DtlsSession *this,event_base *aEventBase,bool aIsServer,SocketPtr *aSocket)

{
  event_base *aEventBase_00;
  element_type *peVar1;
  anon_class_8_1_8991fb9c local_88;
  function<void_(short)> local_80;
  anon_class_8_1_8991fb9c local_50;
  Action local_48;
  SocketPtr *local_28;
  SocketPtr *aSocket_local;
  event_base *peStack_18;
  bool aIsServer_local;
  event_base *aEventBase_local;
  DtlsSession *this_local;
  
  local_28 = aSocket;
  aSocket_local._7_1_ = aIsServer;
  peStack_18 = aEventBase;
  aEventBase_local = (event_base *)this;
  Endpoint::Endpoint(&this->super_Endpoint);
  (this->super_Endpoint)._vptr_Endpoint = (_func_int **)&PTR__DtlsSession_00482618;
  std::shared_ptr<ot::commissioner::Socket>::shared_ptr(&this->mSocket,aSocket);
  aEventBase_00 = peStack_18;
  local_50.this = this;
  std::function<void(ot::commissioner::Timer&)>::
  function<ot::commissioner::DtlsSession::DtlsSession(event_base*,bool,std::shared_ptr<ot::commissioner::Socket>)::__0,void>
            ((function<void(ot::commissioner::Timer&)> *)&local_48,&local_50);
  DtlsTimer::DtlsTimer(&this->mHandshakeTimer,aEventBase_00,&local_48);
  std::function<void_(ot::commissioner::Timer_&)>::~function(&local_48);
  this->mState = kOpen;
  this->mIsServer = (bool)(aSocket_local._7_1_ & 1);
  this->mIsClientIdSet = false;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mKek);
  std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::function
            (&this->mOnConnected,(nullptr_t)0x0);
  std::
  queue<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>>
  ::
  queue<std::deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>,void>
            ((queue<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>>
              *)&this->mSendQueue);
  std::vector<int,_std::allocator<int>_>::vector(&this->mCipherSuites);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mPSK);
  peVar1 = std::
           __shared_ptr_access<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->mSocket);
  local_88.this = this;
  std::function<void(short)>::
  function<ot::commissioner::DtlsSession::DtlsSession(event_base*,bool,std::shared_ptr<ot::commissioner::Socket>)::__1,void>
            ((function<void(short)> *)&local_80,&local_88);
  (*peVar1->_vptr_Socket[8])(peVar1,&local_80);
  std::function<void_(short)>::~function(&local_80);
  InitMbedtls(this);
  return;
}

Assistant:

DtlsSession::DtlsSession(struct event_base *aEventBase, bool aIsServer, SocketPtr aSocket)
    : mSocket(aSocket)
    , mHandshakeTimer(aEventBase, [this](Timer &aTimer) { HandshakeTimerCallback(aTimer); })
    , mState(State::kOpen)
    , mIsServer(aIsServer)
{
    mSocket->SetEventHandler([this](short aFlags) { HandleEvent(aFlags); });
    InitMbedtls();
}